

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::CopyAttConfig::endCopyAttachmentsFrom(CopyAttConfig *this)

{
  allocator<char> local_31;
  string local_30;
  
  if ((this->caf).path._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"copy attachments: no file specified",&local_31);
    usage(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__cxx11::list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>::
  push_back(&((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->attachments_to_copy,&this->caf);
  return this->config;
}

Assistant:

QPDFJob::Config*
QPDFJob::CopyAttConfig::endCopyAttachmentsFrom()
{
    if (this->caf.path.empty()) {
        usage("copy attachments: no file specified");
    }
    this->config->o.m->attachments_to_copy.push_back(this->caf);
    return this->config;
}